

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collapse_unit_test.cpp
# Opt level: O0

void __thiscall collapse_from_array::test_method(collapse_from_array *this)

{
  initializer_list<std::tuple<short,_short,_float>_> __l;
  ostream *this_00;
  allocator<std::tuple<short,_short,_float>_> local_e1;
  double local_e0;
  int local_d8 [2];
  tuple<short,_short,_float> local_d0;
  tuple<short,_short,_float> *local_c8;
  size_type local_c0;
  vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>
  local_b8;
  double local_a0;
  int local_98 [2];
  double local_90;
  int local_88 [2];
  double local_80;
  int local_78 [2];
  double local_70;
  int local_68 [2];
  double local_60;
  int local_58 [2];
  double local_50;
  int local_48 [2];
  undefined1 local_40 [8];
  array<std::tuple<short,_short,_float>,_6UL> f_edge_array;
  collapse_from_array *this_local;
  
  f_edge_array._M_elems[5].super__Tuple_impl<0UL,_short,_short,_float>.
  super__Tuple_impl<1UL,_short,_float> =
       (_Tuple_impl<0UL,_short,_short,_float>)(_Tuple_impl<0UL,_short,_short,_float>)this;
  this_00 = std::operator<<((ostream *)&std::cout,"***** COLLAPSE FROM ARRAY *****");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  local_48[1] = 0;
  local_48[0] = 1;
  local_50 = 1.0;
  std::tuple<short,_short,_float>::tuple<int,_int,_double,_true,_true>
            ((tuple<short,_short,_float> *)local_40,local_48 + 1,local_48,&local_50);
  local_58[1] = 1;
  local_58[0] = 2;
  local_60 = 1.0;
  std::tuple<short,_short,_float>::tuple<int,_int,_double,_true,_true>
            (f_edge_array._M_elems,local_58 + 1,local_58,&local_60);
  local_68[1] = 2;
  local_68[0] = 3;
  local_70 = 1.0;
  std::tuple<short,_short,_float>::tuple<int,_int,_double,_true,_true>
            (f_edge_array._M_elems + 1,local_68 + 1,local_68,&local_70);
  local_78[1] = 3;
  local_78[0] = 0;
  local_80 = 1.0;
  std::tuple<short,_short,_float>::tuple<int,_int,_double,_true,_true>
            (f_edge_array._M_elems + 2,local_78 + 1,local_78,&local_80);
  local_88[1] = 0;
  local_88[0] = 2;
  local_90 = 2.0;
  std::tuple<short,_short,_float>::tuple<int,_int,_double,_true,_true>
            (f_edge_array._M_elems + 3,local_88 + 1,local_88,&local_90);
  local_98[1] = 1;
  local_98[0] = 3;
  local_a0 = 2.1;
  std::tuple<short,_short,_float>::tuple<int,_int,_double,_true,_true>
            (f_edge_array._M_elems + 4,local_98 + 1,local_98,&local_a0);
  local_d8[1] = 1;
  local_d8[0] = 3;
  local_e0 = 2.1;
  std::tuple<short,_short,_float>::tuple<int,_int,_double,_true,_true>
            (&local_d0,local_d8 + 1,local_d8,&local_e0);
  local_c0 = 1;
  local_c8 = &local_d0;
  std::allocator<std::tuple<short,_short,_float>_>::allocator(&local_e1);
  __l._M_len = local_c0;
  __l._M_array = local_c8;
  std::vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>::
  vector(&local_b8,__l,&local_e1);
  trace_and_check_collapse<std::array<std::tuple<short,short,float>,6ul>>
            ((array<std::tuple<short,_short,_float>,_6UL> *)local_40,&local_b8);
  std::vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>::
  ~vector(&local_b8);
  std::allocator<std::tuple<short,_short,_float>_>::~allocator(&local_e1);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(collapse_from_array) {
  std::cout << "***** COLLAPSE FROM ARRAY *****" << std::endl;
  //  1   2
  //  o---o
  //  |\ /|
  //  | x |
  //  |/ \|
  //  o---o
  //  0   3
  std::array<Filtered_edge, 6> f_edge_array = {{{0, 1, 1.},
                                                {1, 2, 1.},
                                                {2, 3, 1.},
                                                {3, 0, 1.},
                                                {0, 2, 2.},
                                                {1, 3, 2.1}}};
  trace_and_check_collapse(f_edge_array, {{1, 3, 2.1}});
}